

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBruteForceSearch.h
# Opt level: O2

bool __thiscall
BGIP_SolverBruteForceSearch<JointPolicyPureVectorForClusteredBG>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverBruteForceSearch<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  int *piVar1;
  char cVar2;
  E *this_00;
  double dVar3;
  shared_ptr<PartialJPDPValuePair> jppv;
  shared_count local_60;
  shared_ptr<JointPolicyPureVectorForClusteredBG> test;
  shared_ptr<PartialJointPolicyDiscretePure> pjpdp;
  shared_count local_40;
  shared_ptr<JointPolicyDiscretePure> local_38;
  
  if (this->_m_solved == false) {
    (**(code **)(*(long *)&(this->
                           super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>
                           ).super_BGIP_IncrementalSolverInterface + 0x20))(this);
  }
  *value = 0.0;
  cVar2 = BGIPSolution::IsEmptyJPPV();
  if (cVar2 == '\0') {
    BGIPSolution::GetNextSolutionJPPV();
    dVar3 = (double)(**(code **)(*_jppv + 0x18))();
    *value = dVar3;
    if (this->_m_CBGlowerBound <= dVar3) {
      test.px = (element_type *)_jppv[2];
      test.pn.pi_ = (sp_counted_base *)_jppv[3];
      if (_jppv[3] != 0) {
        LOCK();
        piVar1 = (int *)(_jppv[3] + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
                ((boost *)&pjpdp,(shared_ptr<JointPolicyPureVector> *)&test);
      boost::detail::shared_count::~shared_count(&test.pn);
      if (_pjpdp != (element_type *)0x0) {
        test.px = _pjpdp;
        test.pn.pi_ = local_40.pi_;
        if (local_40.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_40.pi_)->use_count_ = (local_40.pi_)->use_count_ + 1;
          UNLOCK();
        }
        boost::shared_ptr<JointPolicyDiscretePure>::operator=
                  (jpol,(shared_ptr<JointPolicyDiscretePure> *)&test);
        boost::detail::shared_count::~shared_count(&test.pn);
        BGIPSolution::PopNextSolutionJPPV();
        goto LAB_0011c66c;
      }
      boost::detail::shared_count::~shared_count(&local_40);
    }
  }
  else {
    cVar2 = BGIPSolution::IsEmptyPJPDP();
    if (cVar2 != '\0') goto LAB_0011c693;
    BGIPSolution::GetNextSolutionPJPDP();
    dVar3 = (double)(**(code **)(*_jppv + 0x18))();
    *value = dVar3;
    if (this->_m_CBGlowerBound <= dVar3) {
      (**(code **)(*_jppv + 0x10))(&pjpdp);
      boost::
      dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
                ((boost *)&test,&pjpdp);
      if (test.px == (element_type *)0x0) {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,"DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!");
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      local_38.px = (element_type *)test.px;
      local_38.pn.pi_ = test.pn.pi_;
      if (test.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (test.pn.pi_)->use_count_ = (test.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::shared_ptr<JointPolicyDiscretePure>::operator=(jpol,&local_38);
      boost::detail::shared_count::~shared_count(&local_38.pn);
      BGIPSolution::PopNextSolutionPJPDP();
      boost::detail::shared_count::~shared_count(&test.pn);
LAB_0011c66c:
      boost::detail::shared_count::~shared_count(&local_40);
      boost::detail::shared_count::~shared_count(&local_60);
      return true;
    }
  }
  boost::detail::shared_count::~shared_count(&local_60);
LAB_0011c693:
  boost::shared_ptr<JointPolicyDiscretePure>::reset(jpol);
  *value = 0.0;
  return false;
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
#if DGNJPAV
        std::cout << "DEBUG: GetNextJointPolicyAndValue called" <<std::endl <<
            "\texpecting a pointer to a "<< typeid(jpol).name() << std::endl;

#endif

        if(!_m_solved)
            Solve();

        // since BFS computes all solutions. we just need to get
        // the next one from the solution and return it

        bool foundSolution = false;
        value = 0;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting from JPPV queue" <<std::endl;
#endif
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            value = jppv->GetValue();
            if(value >= _m_CBGlowerBound)
            {
                boost::shared_ptr<JP> test = boost::dynamic_pointer_cast<JP>(jppv->GetJPPV());
                if(test)
                {
                    foundSolution = true;
                    jpol = boost::static_pointer_cast<JointPolicyDiscretePure>(test);
                    this->PopNextSolutionJPPV();
                }
            }
        }
        else if(!this->IsEmptyPJPDP())
        {
            //alright, if I understand it correctly, it tries to convert the policy returned
            //to a "JointPolicyPureVectorForClusteredBG"
            //
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting from PJPDP queue" <<std::endl;
#endif
            const boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            value = jppv->GetValue();
            if(value >= _m_CBGlowerBound)
            {
                
                boost::shared_ptr<PartialJointPolicyDiscretePure> pjpdp = jppv->GetJPol();
                boost::shared_ptr<JP> test = boost::dynamic_pointer_cast<JP>(pjpdp);
#if DGNJPAV
                std::cout << "\tconversion requested from "<<  typeid( jppv->GetJPol() ).name() 
                          << " to " <<              typeid( test ).name()
                          << std::endl
                          << "\tthe former is a pointer to " <<  typeid( *(jppv->GetJPol()) ).name() 
                          << " ." << std::endl;
#endif
                if(test)
                {
#if DGNJPAV
                    std::cout << "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion success" <<std::endl;
#endif
                    foundSolution = true;
                    //jpol = test;
                    jpol = boost::static_pointer_cast<JointPolicyDiscretePure>(test);
                    this->PopNextSolutionPJPDP();
                }
                else
                {
#if DGNJPAV
                    std::cout << "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!" <<std::endl;
#endif
                    throw E("DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!");
                }
            }
        }
        else
        {
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting ERROR - both queues empty?!?" <<std::endl;
#endif
        }

        if(!foundSolution)
        {
//                std::cout << "value " << value << " " <<  this->_m_nrSolutionsReturned <<  " "
//                          << this->GetNrDesiredSolutions() << " " 
//                          << this->GetBGIPI()->GetNrJointPolicies() << std::endl;
            jpol.reset();
            value = 0;
        }
//             std::cout << "found jpol " << jpol << " value " << value << " and " 
//                       << this->GetNrFoundSolutions()
//                       << " solutions left" 
//                       << std::endl;

        return(foundSolution);
    }